

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O2

QDateTime __thiscall
QLocale::toDateTime(QLocale *this,QString *string,FormatType format,QCalendar cal)

{
  undefined4 in_register_00000014;
  int in_R8D;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  dateTimeFormat((QString *)&QStack_48,(QLocale *)string,(FormatType)cal.d_ptr);
  toDateTime(this,string,(QString *)CONCAT44(in_register_00000014,format),
             (QCalendarBackend *)&QStack_48,in_R8D);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDateTime)(Data)this;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QLocale::toDateTime(const QString &string, FormatType format, QCalendar cal) const
{
    return toDateTime(string, dateTimeFormat(format), cal, DefaultTwoDigitBaseYear);
}